

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_half_float_linear(void *outputp,int width_times_channels,float *encode)

{
  undefined1 (*pauVar1) [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 (*pauVar7) [16];
  float *pfVar8;
  float fVar9;
  stbir__FP16 *output;
  undefined1 (*pauVar10) [16];
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar19 [16];
  float fVar22;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar6 = _DAT_001c40a0;
  pauVar1 = (undefined1 (*) [16])((long)outputp + (long)width_times_channels * 2);
  if (width_times_channels < 8) {
    pauVar10 = (undefined1 (*) [16])outputp;
    if (3 < width_times_channels) {
      do {
        pauVar10 = (undefined1 (*) [16])((long)*(undefined1 (*) [16])outputp + 8);
        fVar11 = ABS(*encode);
        if ((uint)fVar11 < 0x47800000) {
          if ((uint)fVar11 < 0x38800000) {
            fVar9 = fVar11 + 0.5;
          }
          else {
            fVar11 = (float)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar9 = fVar11;
          }
        }
        else {
          fVar9 = (float)((0x7f800000 < (uint)fVar11 | 0x3e) << 9);
        }
        iVar12 = movmskps(fVar11,ZEXT416((uint)*encode));
        *(ushort *)*(undefined1 (*) [16])outputp = (ushort)(iVar12 << 0xf) | SUB42(fVar9,0);
        fVar11 = ABS(encode[1]);
        if ((uint)fVar11 < 0x47800000) {
          if ((uint)fVar11 < 0x38800000) {
            fVar9 = fVar11 + 0.5;
          }
          else {
            fVar11 = (float)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar9 = fVar11;
          }
        }
        else {
          fVar9 = (float)((0x7f800000 < (uint)fVar11 | 0x3e) << 9);
        }
        iVar12 = movmskps(fVar11,ZEXT416((uint)encode[1]));
        *(ushort *)((long)*(undefined1 (*) [16])outputp + 2) =
             (ushort)(iVar12 << 0xf) | SUB42(fVar9,0);
        fVar11 = ABS(encode[2]);
        if ((uint)fVar11 < 0x47800000) {
          if ((uint)fVar11 < 0x38800000) {
            fVar9 = fVar11 + 0.5;
          }
          else {
            fVar11 = (float)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar9 = fVar11;
          }
        }
        else {
          fVar9 = (float)((0x7f800000 < (uint)fVar11 | 0x3e) << 9);
        }
        iVar12 = movmskps(fVar11,ZEXT416((uint)encode[2]));
        *(ushort *)((long)*(undefined1 (*) [16])outputp + 4) =
             (ushort)(iVar12 << 0xf) | SUB42(fVar9,0);
        fVar11 = ABS(encode[3]);
        if ((uint)fVar11 < 0x47800000) {
          if ((uint)fVar11 < 0x38800000) {
            fVar9 = fVar11 + 0.5;
          }
          else {
            fVar11 = (float)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd
                            );
            fVar9 = fVar11;
          }
        }
        else {
          fVar9 = (float)((0x7f800000 < (uint)fVar11 | 0x3e) << 9);
        }
        iVar12 = movmskps(fVar11,ZEXT416((uint)encode[3]));
        *(ushort *)((long)*(undefined1 (*) [16])outputp + 6) =
             (ushort)(iVar12 << 0xf) | SUB42(fVar9,0);
        encode = encode + 4;
        pauVar7 = (undefined1 (*) [16])((long)outputp + 0x10);
        outputp = pauVar10;
      } while (pauVar7 <= pauVar1);
    }
    for (; pauVar10 < pauVar1; pauVar10 = (undefined1 (*) [16])((long)*pauVar10 + 2)) {
      fVar11 = ABS(*encode);
      if ((uint)fVar11 < 0x47800000) {
        if ((uint)fVar11 < 0x38800000) {
          fVar9 = fVar11 + 0.5;
        }
        else {
          fVar11 = (float)((int)fVar11 + 0x8000fff + (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd);
          fVar9 = fVar11;
        }
      }
      else {
        fVar9 = (float)((0x7f800000 < (uint)fVar11 | 0x3e) << 9);
      }
      iVar12 = movmskps(fVar11,ZEXT416((uint)*encode));
      *(ushort *)*pauVar10 = (ushort)(iVar12 << 0xf) | SUB42(fVar9,0);
      encode = encode + 1;
    }
  }
  else {
    pfVar8 = encode;
    do {
      do {
        fVar11 = *pfVar8;
        fVar9 = pfVar8[1];
        fVar20 = pfVar8[2];
        fVar21 = pfVar8[3];
        fVar2 = pfVar8[4];
        fVar3 = pfVar8[5];
        fVar4 = pfVar8[6];
        fVar5 = pfVar8[7];
        fVar22 = ABS(fVar11);
        fVar25 = ABS(fVar9);
        fVar26 = ABS(fVar20);
        fVar27 = ABS(fVar21);
        auVar16._0_4_ = -(uint)(0x387fffff < (uint)fVar22);
        auVar16._4_4_ = -(uint)(0x387fffff < (uint)fVar25);
        auVar16._8_4_ = -(uint)(0x387fffff < (uint)fVar26);
        auVar16._12_4_ = -(uint)(0x387fffff < (uint)fVar27);
        auVar28._0_4_ = (int)(fVar22 + 0.5) + -0x3f000000;
        auVar28._4_4_ = (int)(fVar25 + 0.5) + -0x3f000000;
        auVar28._8_4_ = (int)(fVar26 + 0.5) + -0x3f000000;
        auVar28._12_4_ = (int)(fVar27 + 0.5) + -0x3f000000;
        auVar18._0_4_ = (int)fVar22 + -0x37fff001 + ((uint)fVar11 >> 0xd & 1) >> 0xd;
        auVar18._4_4_ = (int)fVar25 + -0x37fff001 + ((uint)fVar9 >> 0xd & 1) >> 0xd;
        auVar18._8_4_ = (int)fVar26 + -0x37fff001 + ((uint)fVar20 >> 0xd & 1) >> 0xd;
        auVar18._12_4_ = (int)fVar27 + -0x37fff001 + ((uint)fVar21 >> 0xd & 1) >> 0xd;
        auVar23._0_4_ = -(uint)(0x477fffff < (uint)fVar22);
        auVar23._4_4_ = -(uint)(0x477fffff < (uint)fVar25);
        auVar23._8_4_ = -(uint)(0x477fffff < (uint)fVar26);
        auVar23._12_4_ = -(uint)(0x477fffff < (uint)fVar27);
        auVar29._0_4_ = (-(uint)NAN(fVar22) & 0x200 | 0x7c00) & auVar23._0_4_;
        auVar29._4_4_ = (-(uint)NAN(fVar25) & 0x200 | 0x7c00) & auVar23._4_4_;
        auVar29._8_4_ = (-(uint)NAN(fVar26) & 0x200 | 0x7c00) & auVar23._8_4_;
        auVar29._12_4_ = (-(uint)NAN(fVar27) & 0x200 | 0x7c00) & auVar23._12_4_;
        auVar15._0_4_ = (int)fVar11 >> 0x10;
        auVar15._4_4_ = (int)fVar9 >> 0x10;
        auVar15._8_4_ = (int)fVar20 >> 0x10;
        auVar15._12_4_ = (int)fVar21 >> 0x10;
        fVar11 = ABS(fVar2);
        fVar9 = ABS(fVar3);
        fVar20 = ABS(fVar4);
        fVar21 = ABS(fVar5);
        auVar24._0_4_ = -(uint)(0x387fffff < (uint)fVar11);
        auVar24._4_4_ = -(uint)(0x387fffff < (uint)fVar9);
        auVar24._8_4_ = -(uint)(0x387fffff < (uint)fVar20);
        auVar24._12_4_ = -(uint)(0x387fffff < (uint)fVar21);
        auVar13._0_4_ = (int)(fVar11 + 0.5) + -0x3f000000;
        auVar13._4_4_ = (int)(fVar9 + 0.5) + -0x3f000000;
        auVar13._8_4_ = (int)(fVar20 + 0.5) + -0x3f000000;
        auVar13._12_4_ = (int)(fVar21 + 0.5) + -0x3f000000;
        auVar30._0_4_ = (int)fVar11 + -0x37fff001 + ((uint)fVar2 >> 0xd & 1) >> 0xd;
        auVar30._4_4_ = (int)fVar9 + -0x37fff001 + ((uint)fVar3 >> 0xd & 1) >> 0xd;
        auVar30._8_4_ = (int)fVar20 + -0x37fff001 + ((uint)fVar4 >> 0xd & 1) >> 0xd;
        auVar30._12_4_ = (int)fVar21 + -0x37fff001 + ((uint)fVar5 >> 0xd & 1) >> 0xd;
        auVar19._0_4_ = -(uint)(0x477fffff < (uint)fVar11);
        auVar19._4_4_ = -(uint)(0x477fffff < (uint)fVar9);
        auVar19._8_4_ = -(uint)(0x477fffff < (uint)fVar20);
        auVar19._12_4_ = -(uint)(0x477fffff < (uint)fVar21);
        auVar14._0_4_ = (-(uint)NAN(fVar11) & 0x200 | 0x7c00) & auVar19._0_4_;
        auVar14._4_4_ = (-(uint)NAN(fVar9) & 0x200 | 0x7c00) & auVar19._4_4_;
        auVar14._8_4_ = (-(uint)NAN(fVar20) & 0x200 | 0x7c00) & auVar19._8_4_;
        auVar14._12_4_ = (-(uint)NAN(fVar21) & 0x200 | 0x7c00) & auVar19._12_4_;
        auVar17._0_4_ = (int)fVar2 >> 0x10;
        auVar17._4_4_ = (int)fVar3 >> 0x10;
        auVar17._8_4_ = (int)fVar4 >> 0x10;
        auVar17._12_4_ = (int)fVar5 >> 0x10;
        auVar16 = packssdw(auVar15 & auVar6 | auVar29 |
                           ~auVar23 & (~auVar16 & auVar28 | auVar18 & auVar16),
                           auVar17 & auVar6 | auVar14 |
                           ~auVar19 & (~auVar24 & auVar13 | auVar30 & auVar24));
        *(undefined1 (*) [16])outputp = auVar16;
        pauVar10 = (undefined1 (*) [16])((long)outputp + 0x10);
        pfVar8 = pfVar8 + 8;
        outputp = pauVar10;
      } while (pauVar10 <= pauVar1 + -1);
      pfVar8 = encode + (long)width_times_channels + -8;
      outputp = pauVar1 + -1;
    } while (pauVar10 != pauVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_half_float_linear )( void * outputp, int width_times_channels, float const * encode )
{
  stbir__FP16 STBIR_SIMD_STREAMOUT_PTR( * ) output = (stbir__FP16*) outputp;
  stbir__FP16 * end_output = ( (stbir__FP16*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    float const * end_encode_m8 = encode + width_times_channels - 8;
    end_output -= 8;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_SIMD_NO_UNROLL(encode);
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, encode );
        stbir__encode_simdf8_unflip( of );
        stbir__float_to_half_SIMD( output, (float*)&of );
      }
      #else
      {
        stbir__simdf of[2];
        stbir__simdf_load( of[0], encode );
        stbir__simdf_load( of[1], encode+4 );
        stbir__encode_simdf4_unflip( of[0] );
        stbir__encode_simdf4_unflip( of[1] );
        stbir__float_to_half_SIMD( output, (float*)of );
      }
      #endif
      #else
      stbir__float_to_half_SIMD( output, encode );
      #endif
      encode += 8;
      output += 8;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 8 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(output);
    output[0-4] = stbir__float_to_half(encode[stbir__encode_order0]);
    output[1-4] = stbir__float_to_half(encode[stbir__encode_order1]);
    output[2-4] = stbir__float_to_half(encode[stbir__encode_order2]);
    output[3-4] = stbir__float_to_half(encode[stbir__encode_order3]);
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(output);
    output[0] = stbir__float_to_half(encode[stbir__encode_order0]);
    #if stbir__coder_min_num >= 2
    output[1] = stbir__float_to_half(encode[stbir__encode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__float_to_half(encode[stbir__encode_order2]);
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}